

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_decode_scanline(spng_ctx *ctx,void *out,size_t len)

{
  size_t rowbytes;
  spng_subimage *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  spng_format fmt;
  uint width;
  uint32_t uVar8;
  undefined4 uVar9;
  uint16_t *puVar10;
  uchar *prev;
  ushort uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  byte bVar15;
  byte bVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  size_t sVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ushort uVar30;
  uint uVar31;
  uint uVar32;
  uchar *puVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  uint bit_depth;
  ushort *puVar37;
  uint uVar38;
  uint uVar39;
  long lVar40;
  byte *pbVar41;
  byte *pbVar42;
  uint uVar43;
  uint uVar44;
  uchar uVar45;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  undefined1 auVar46 [16];
  char cVar50;
  byte bVar51;
  char cVar52;
  byte bVar53;
  char cVar54;
  byte bVar55;
  char cVar56;
  byte bVar57;
  char cVar58;
  byte bVar59;
  char cVar60;
  byte bVar61;
  char cVar62;
  byte bVar63;
  char cVar64;
  byte bVar65;
  char cVar66;
  byte bVar67;
  char cVar68;
  byte bVar69;
  char cVar70;
  byte bVar71;
  char cVar72;
  byte bVar73;
  char cVar74;
  byte bVar75;
  char cVar76;
  byte bVar77;
  char cVar78;
  byte bVar79;
  char cVar80;
  byte bVar81;
  uint local_ac;
  uint local_a8;
  uint local_94;
  ushort local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  byte *local_60;
  byte *local_50;
  
  if (out == (void *)0x0 || ctx == (spng_ctx *)0x0) {
    return 1;
  }
  if (SPNG_STATE_DECODE_INIT < ctx->state) {
    return 0x4b;
  }
  bVar15 = (ctx->ihdr).bit_depth;
  uVar5 = *(ushort *)&ctx->decode_flags;
  iVar21 = (ctx->row_info).pass;
  fmt = ctx->fmt;
  uVar23 = (uint)bVar15;
  bit_depth = 8;
  if ((uVar5 & 8) == 0) {
    bit_depth = uVar23;
  }
  lVar40 = 8;
  if (fmt != SPNG_FMT_RGBA16) {
    lVar40 = (ulong)(fmt != SPNG_FMT_RGB8) + 3;
  }
  if (len < ctx->subimage[iVar21].out_width) {
    return 0x42;
  }
  puVar10 = ctx->gamma_lut;
  local_60 = ctx->scanline;
  psVar1 = ctx->subimage + iVar21;
  sVar24 = psVar1->scanline_width;
  width = psVar1->width;
  uVar29 = (ulong)width;
  uVar8 = (ctx->row_info).scanline_idx;
  if ((uVar8 == psVar1->height - 1) && (iVar21 == ctx->last_pass)) {
    iVar21 = read_scanline_bytes(ctx,local_60,sVar24 - 1);
    if (iVar21 != 0) goto LAB_00102ee2;
    bVar16 = 0;
  }
  else {
    iVar21 = read_scanline_bytes(ctx,local_60,sVar24);
    if (iVar21 != 0) goto LAB_00102ee2;
    bVar16 = ctx->scanline[sVar24 - 1];
    iVar21 = 0x41;
    if (4 < bVar16) goto LAB_00102ee2;
  }
  if ((uVar8 == 0) && (1 < (ctx->row_info).filter)) {
    memset(ctx->prev_scanline,0,sVar24);
  }
  if ((ctx->ihdr).bit_depth == '\x10') {
    puVar33 = ctx->scanline;
    if ((ctx->fmt != SPNG_FMT_RAW) && (1 < sVar24 - 1)) {
      uVar27 = 0;
      do {
        puVar37 = (ushort *)(puVar33 + uVar27 * 2);
        *puVar37 = *puVar37 << 8 | *puVar37 >> 8;
        uVar27 = uVar27 + 1;
      } while (sVar24 - 1 >> 1 != uVar27);
    }
  }
  else {
    puVar33 = ctx->scanline;
  }
  iVar21 = 0x50;
  if (((sVar24 == 0) || (prev = ctx->prev_scanline, prev == (uchar *)0x0)) ||
     (puVar33 == (uchar *)0x0)) goto LAB_00102ee2;
  uVar4 = (ctx->row_info).filter;
  rowbytes = sVar24 - 1;
  if (uVar4 != '\0') {
    if (uVar4 == '\x02') {
      if (rowbytes != 0) {
        sVar24 = 0;
        do {
          puVar33[sVar24] = puVar33[sVar24] + prev[sVar24];
          sVar24 = sVar24 + 1;
        } while (rowbytes != sVar24);
      }
    }
    else {
      uVar27 = (ulong)ctx->bytes_per_pixel;
      if (uVar27 == 3) {
        if (uVar4 == '\x04') {
          defilter_paeth3(rowbytes,puVar33,prev);
        }
        else if (uVar4 == '\x03') {
          defilter_avg3(rowbytes,puVar33,prev);
        }
        else {
          iVar21 = 0x41;
          if (uVar4 != '\x01') goto LAB_00102ee2;
          defilter_sub3(rowbytes,puVar33);
        }
      }
      else if (ctx->bytes_per_pixel == 4) {
        if (uVar4 == '\x04') {
          defilter_paeth4(rowbytes,puVar33,prev);
        }
        else if (uVar4 == '\x03') {
          uVar27 = sVar24 + 3;
          if (4 < uVar27) {
            bVar51 = 0;
            bVar53 = 0;
            bVar55 = 0;
            bVar57 = 0;
            bVar59 = 0;
            bVar61 = 0;
            bVar63 = 0;
            bVar65 = 0;
            bVar67 = 0;
            bVar69 = 0;
            bVar71 = 0;
            bVar73 = 0;
            bVar75 = 0;
            bVar77 = 0;
            bVar79 = 0;
            bVar81 = 0;
            lVar25 = 0;
            do {
              pbVar41 = prev + lVar25;
              uVar9 = *(undefined4 *)(puVar33 + lVar25);
              cVar50 = pavgb(bVar51,*pbVar41);
              cVar52 = pavgb(bVar53,pbVar41[1]);
              cVar54 = pavgb(bVar55,pbVar41[2]);
              cVar56 = pavgb(bVar57,pbVar41[3]);
              cVar58 = pavgb(bVar59,0);
              cVar60 = pavgb(bVar61,0);
              cVar62 = pavgb(bVar63,0);
              cVar64 = pavgb(bVar65,0);
              cVar66 = pavgb(bVar67,0);
              cVar68 = pavgb(bVar69,0);
              cVar70 = pavgb(bVar71,0);
              cVar72 = pavgb(bVar73,0);
              cVar74 = pavgb(bVar75,0);
              cVar76 = pavgb(bVar77,0);
              cVar78 = pavgb(bVar79,0);
              cVar80 = pavgb(bVar81,0);
              bVar59 = cVar58 - (bVar59 & 1);
              bVar61 = cVar60 - (bVar61 & 1);
              bVar63 = cVar62 - (bVar63 & 1);
              bVar65 = cVar64 - (bVar65 & 1);
              bVar67 = cVar66 - (bVar67 & 1);
              bVar69 = cVar68 - (bVar69 & 1);
              bVar71 = cVar70 - (bVar71 & 1);
              bVar73 = cVar72 - (bVar73 & 1);
              bVar75 = cVar74 - (bVar75 & 1);
              bVar77 = cVar76 - (bVar77 & 1);
              bVar79 = cVar78 - (bVar79 & 1);
              bVar81 = cVar80 - (bVar81 & 1);
              bVar51 = (cVar50 - ((bVar51 ^ *pbVar41) & 1)) + (char)uVar9;
              bVar53 = (cVar52 - ((bVar53 ^ pbVar41[1]) & 1)) + (char)((uint)uVar9 >> 8);
              bVar55 = (cVar54 - ((bVar55 ^ pbVar41[2]) & 1)) + (char)((uint)uVar9 >> 0x10);
              bVar57 = (cVar56 - ((bVar57 ^ pbVar41[3]) & 1)) + (char)((uint)uVar9 >> 0x18);
              pbVar41 = puVar33 + lVar25;
              *pbVar41 = bVar51;
              pbVar41[1] = bVar53;
              pbVar41[2] = bVar55;
              pbVar41[3] = bVar57;
              uVar27 = uVar27 - 4;
              lVar25 = lVar25 + 4;
            } while (4 < uVar27);
          }
        }
        else {
          iVar21 = 0x41;
          if (uVar4 != '\x01') goto LAB_00102ee2;
          uVar27 = sVar24 + 3;
          if (4 < uVar27) {
            uVar45 = '\0';
            uVar47 = '\0';
            uVar48 = '\0';
            uVar49 = '\0';
            do {
              uVar9 = *(undefined4 *)puVar33;
              uVar45 = uVar45 + (char)uVar9;
              uVar47 = uVar47 + (char)((uint)uVar9 >> 8);
              uVar48 = uVar48 + (char)((uint)uVar9 >> 0x10);
              uVar49 = uVar49 + (char)((uint)uVar9 >> 0x18);
              *puVar33 = uVar45;
              puVar33[1] = uVar47;
              puVar33[2] = uVar48;
              puVar33[3] = uVar49;
              puVar33 = puVar33 + 4;
              uVar27 = uVar27 - 4;
            } while (4 < uVar27);
          }
        }
      }
      else if (rowbytes != 0) {
        uVar34 = 0;
        do {
          if (uVar34 < uVar27) {
            bVar51 = 0;
            bVar53 = 0;
          }
          else {
            bVar51 = puVar33[uVar34 - uVar27];
            bVar53 = prev[uVar34 - uVar27];
          }
          bVar55 = prev[uVar34];
          uVar30 = (ushort)bVar55;
          uVar45 = puVar33[uVar34];
          if (uVar4 == '\x04') {
            iVar21 = (uint)bVar51 - (uint)bVar53;
            uVar32 = (uint)uVar30 - (uint)bVar53;
            uVar44 = -uVar32;
            if (0 < (int)uVar32) {
              uVar44 = uVar32;
            }
            bVar57 = -(byte)iVar21;
            if (0 < iVar21) {
              bVar57 = (byte)iVar21;
            }
            uVar22 = (iVar21 + (uint)uVar30) - (uint)bVar53;
            uVar32 = -uVar22;
            if (0 < (int)uVar22) {
              uVar32 = uVar22;
            }
            if (bVar57 <= uVar32) {
              bVar53 = bVar55;
            }
            if (uVar32 < uVar44) {
              bVar51 = bVar53;
            }
            if (bVar57 <= uVar44 && uVar44 != bVar57) {
              bVar51 = bVar53;
            }
            uVar45 = bVar51 + uVar45;
          }
          else if (uVar4 == '\x03') {
            uVar45 = uVar45 + (char)((uint)uVar30 + (uint)bVar51 >> 1);
          }
          else if (uVar4 == '\x01') {
            uVar45 = uVar45 + bVar51;
          }
          puVar33[uVar34] = uVar45;
          uVar34 = uVar34 + 1;
        } while (rowbytes != uVar34);
      }
    }
  }
  (ctx->row_info).filter = bVar16;
  pbVar41 = ctx->scanline;
  if (uVar29 != 0) {
    local_88 = uVar5 & 1;
    if ((uVar5 & 0x40) == 0) {
      if ((uVar5 >> 8 & 1) == 0) {
        bVar15 = ~(byte)(-1 << (bVar15 & 0x1f));
        uVar22 = 8 - uVar23;
        uVar27 = uVar29 * 4;
        uVar28 = 2;
        uVar34 = 0;
        uVar38 = 0;
        uVar39 = 0;
        uVar36 = 0;
        local_80 = 0;
        local_a8 = 0;
        uVar43 = 0;
        local_ac = 0;
        uVar32 = 0;
        local_94 = 0;
        local_78 = 0;
        uVar44 = 0;
        puVar37 = (ushort *)out;
        local_84 = uVar22;
        local_50 = pbVar41;
LAB_001027ab:
        iVar21 = (int)uVar34;
        bVar16 = (byte)local_84;
        switch((ctx->ihdr).color_type) {
        case '\0':
          if ((ctx->ihdr).bit_depth == '\x10') {
            uVar43 = (uint)*(ushort *)(pbVar41 + uVar38);
            uVar32 = uVar43;
            local_ac = uVar43;
            if ((local_88 == 0) || ((ctx->trns).gray != *(ushort *)(pbVar41 + uVar38))) {
              local_a8 = 0xffff;
            }
            else {
              local_a8 = 0;
            }
          }
          else {
            bVar51 = *local_60;
            uVar44 = local_84 - uVar23;
            local_84 = uVar44;
            if (7 < uVar44) {
              local_84 = uVar22;
            }
            local_60 = local_60 + (7 < uVar44);
            bVar16 = bVar51 >> (bVar16 & 0x1f) & bVar15;
            uVar44 = (uint)bVar16;
            if ((local_88 == 0) || ((ctx->trns).gray != (ushort)bVar16)) {
              local_94 = 0xff;
            }
            else {
              local_94 = 0;
            }
            local_78 = (ulong)uVar44;
            local_80 = (ulong)uVar44;
          }
          break;
        default:
          goto switchD_001027cb_caseD_1;
        case '\x02':
          if ((ctx->ihdr).bit_depth == '\x10') {
            uVar30 = *(ushort *)(pbVar41 + uVar36);
            uVar6 = *(ushort *)(pbVar41 + (ulong)uVar36 + 2);
            uVar7 = *(ushort *)(pbVar41 + (ulong)uVar36 + 4);
            local_a8 = 0xffff;
LAB_001028b1:
            local_ac = (uint)uVar6;
            uVar43 = (uint)uVar7;
            uVar32 = (uint)uVar30;
            break;
          }
          if (fmt != SPNG_FMT_RGBA8) {
            bVar53 = pbVar41[uVar28 - 2];
            bVar51 = pbVar41[uVar28 - 1];
            bVar16 = pbVar41[uVar28];
            local_94 = 0xff;
            goto LAB_00102a2e;
          }
          uVar23 = 0;
          uVar34 = 0;
          do {
            *(byte *)((long)out + (uVar34 & 0xffffffff) + 2) = pbVar41[(ulong)uVar23 + 2];
            *(undefined2 *)((long)out + (uVar34 & 0xffffffff)) = *(undefined2 *)(pbVar41 + uVar23);
            *(undefined1 *)((long)out + (ulong)((int)uVar34 + 3)) = 0xff;
            uVar34 = uVar34 + 4;
            uVar23 = uVar23 + 3;
          } while (uVar27 != uVar34);
          goto LAB_00102c83;
        case '\x03':
          if ((ctx->ihdr).bit_depth == '\b') {
            if ((fmt & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
              bVar16 = *local_50;
LAB_00102b85:
              uVar26 = (ulong)bVar16;
              uVar30 = CONCAT11(ctx->trns_px[uVar26 * 4 + 8],ctx->trns_px[uVar26 * 4 + 8]);
              uVar32 = (uint)uVar30;
              uVar6 = CONCAT11(ctx->trns_px[uVar26 * 4 + 9],ctx->trns_px[uVar26 * 4 + 9]);
              local_ac = (uint)uVar6;
              uVar7 = CONCAT11(ctx->trns_px[uVar26 * 4 + 10],ctx->trns_px[uVar26 * 4 + 10]);
              uVar43 = (uint)uVar7;
              uVar11 = CONCAT11(ctx->trns_px[uVar26 * 4 + 0xb],ctx->trns_px[uVar26 * 4 + 0xb]);
              local_a8 = (uint)uVar11;
              *puVar37 = uVar30;
              puVar37[1] = uVar6;
              puVar37[2] = uVar7;
              puVar37[3] = uVar11;
              goto LAB_00102b53;
            }
            if (fmt == SPNG_FMT_RGBA8) {
              uVar34 = 0;
              pbVar42 = pbVar41;
              do {
                uVar26 = uVar34 & 0xffffffff;
                uVar35 = (ulong)*pbVar42;
                *(uchar *)((long)out + uVar26) = ctx->trns_px[uVar35 * 4 + 8];
                *(uchar *)((long)out + uVar26 + 1) = ctx->trns_px[uVar35 * 4 + 9];
                *(uchar *)((long)out + uVar26 + 2) = ctx->trns_px[uVar35 * 4 + 10];
                *(uchar *)((long)out + uVar26 + 3) = ctx->trns_px[uVar35 * 4 + 0xb];
                uVar34 = uVar34 + 4;
                pbVar42 = pbVar42 + 1;
              } while (uVar27 != uVar34);
            }
            else if (fmt == SPNG_FMT_RGB8) {
              uVar27 = 0;
              pbVar42 = pbVar41;
              do {
                uVar34 = uVar27 & 0xffffffff;
                uVar26 = (ulong)*pbVar42;
                *(uchar *)((long)out + uVar34) = ctx->trns_px[uVar26 * 4 + 8];
                *(uchar *)((long)out + uVar34 + 1) = ctx->trns_px[uVar26 * 4 + 9];
                *(uchar *)((long)out + uVar34 + 2) = ctx->trns_px[uVar26 * 4 + 10];
                uVar27 = uVar27 + 3;
                pbVar42 = pbVar42 + 1;
              } while (uVar29 * 3 != uVar27);
            }
            goto LAB_00102c83;
          }
          bVar51 = *local_60;
          uVar31 = local_84 - uVar23;
          local_84 = uVar31;
          if (7 < uVar31) {
            local_84 = uVar22;
          }
          local_60 = local_60 + (7 < uVar31);
          bVar16 = bVar51 >> (bVar16 & 0x1f) & bVar15;
          if ((fmt & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) goto LAB_00102b85;
          uVar26 = (ulong)bVar16;
          *(uchar *)puVar37 = ctx->trns_px[uVar26 * 4 + 8];
          *(uchar *)((long)puVar37 + 1) = ctx->trns_px[uVar26 * 4 + 9];
          *(uchar *)(puVar37 + 1) = ctx->trns_px[uVar26 * 4 + 10];
          if (fmt == SPNG_FMT_RGBA8) {
            *(uchar *)((long)puVar37 + 3) = ctx->trns_px[uVar26 * 4 + 0xb];
          }
          goto LAB_00102b53;
        case '\x04':
          if ((ctx->ihdr).bit_depth != '\x10') {
            local_80 = CONCAT71(0x10c0,pbVar41[uVar38]);
            local_94 = (uint)pbVar41[uVar38 + 1];
            uVar44 = (uint)local_80;
            local_78 = local_80;
            goto switchD_001027cb_caseD_1;
          }
          uVar43 = (uint)*(ushort *)(pbVar41 + (uVar34 & 0xffffffff));
          local_a8 = (uint)*(ushort *)(pbVar41 + (uVar34 & 0xffffffff) + 2);
          uVar32 = uVar43;
          local_ac = uVar43;
          break;
        case '\x06':
          if ((ctx->ihdr).bit_depth == '\x10') {
            uVar30 = *(ushort *)(pbVar41 + uVar39);
            uVar6 = *(ushort *)(pbVar41 + (ulong)uVar39 + 2);
            uVar7 = *(ushort *)(pbVar41 + (ulong)uVar39 + 4);
            local_a8 = (uint)*(ushort *)(pbVar41 + (ulong)uVar39 + 6);
            goto LAB_001028b1;
          }
          bVar53 = pbVar41[uVar34 & 0xffffffff];
          bVar51 = pbVar41[iVar21 + 1];
          bVar16 = pbVar41[iVar21 + 2];
          local_94 = (uint)pbVar41[iVar21 + 3];
LAB_00102a2e:
          uVar44 = (uint)bVar51;
          local_78 = (ulong)bVar16;
          local_80 = (ulong)bVar53;
          goto switchD_001027cb_caseD_1;
        }
        goto LAB_00102a6e;
      }
      unpack_scanline((uchar *)out,pbVar41,width,(uint)(ctx->ihdr).bit_depth,fmt);
    }
    else if (-1 < (char)uVar5) {
      memcpy(out,pbVar41,rowbytes);
    }
  }
LAB_00102c83:
  if ((uVar5 & 1) != 0) {
    puVar33 = ctx->trns_px;
    uVar27 = (ulong)ctx->bytes_per_pixel;
    if ((int)fmt < 0x10) {
      if (fmt == SPNG_FMT_RGBA8) {
        if ((uVar29 != 0) && ((ctx->ihdr).color_type != '\0')) {
          lVar40 = 0;
          do {
            iVar21 = bcmp(pbVar41,puVar33,uVar27);
            if (iVar21 == 0) {
              *(undefined1 *)((long)out + lVar40 * 4 + 3) = 0;
            }
            pbVar41 = pbVar41 + uVar27;
            lVar40 = lVar40 + 1;
          } while (width != (uint)lVar40);
        }
      }
      else if (((fmt == SPNG_FMT_RGBA16) && (uVar29 != 0)) && ((ctx->ihdr).color_type != '\0')) {
        lVar40 = 0;
        do {
          iVar21 = bcmp(pbVar41,puVar33,uVar27);
          if (iVar21 == 0) {
            *(undefined2 *)((long)out + lVar40 * 8 + 6) = 0;
          }
          pbVar41 = pbVar41 + uVar27;
          lVar40 = lVar40 + 1;
        } while (width != (uint)lVar40);
      }
    }
    else {
      bVar15 = (ctx->ihdr).bit_depth;
      if (fmt == SPNG_FMT_GA8) {
        uVar23 = (uint)bVar15;
        if (uVar23 == 0x10) {
          if (uVar29 != 0) {
            lVar40 = 0;
            do {
              iVar21 = bcmp(pbVar41,puVar33,uVar27);
              if (iVar21 == 0) {
                *(undefined1 *)((long)out + lVar40 * 2 + 1) = 0;
              }
              pbVar41 = pbVar41 + uVar27;
              lVar40 = lVar40 + 1;
            } while (width != (uint)lVar40);
          }
        }
        else if (uVar29 != 0) {
          lVar40 = 0;
          uVar44 = 8 - uVar23;
          do {
            bVar16 = *pbVar41;
            uVar22 = uVar44 - uVar23;
            uVar32 = uVar22;
            if (7 < uVar22) {
              uVar32 = 8 - uVar23;
            }
            pbVar41 = pbVar41 + (7 < uVar22);
            if (*puVar33 == (byte)(bVar16 >> ((byte)uVar44 & 0x1f) & ~(byte)(-1 << (bVar15 & 0x1f)))
               ) {
              *(undefined1 *)((long)out + lVar40 * 2 + 1) = 0;
            }
            lVar40 = lVar40 + 1;
            uVar44 = uVar32;
          } while (width != (uint)lVar40);
        }
      }
      else if (fmt == SPNG_FMT_GA16) {
        if (bVar15 == 0x10) {
          if (uVar29 != 0) {
            lVar40 = 0;
            do {
              if (*(short *)pbVar41 == *(short *)puVar33) {
                *(undefined2 *)((long)out + lVar40 * 4 + 2) = 0;
              }
              pbVar41 = pbVar41 + uVar27;
              lVar40 = lVar40 + 1;
            } while (width != (uint)lVar40);
          }
        }
        else if (uVar29 != 0) {
          uVar44 = 8 - bVar15;
          lVar40 = 0;
          uVar23 = uVar44;
          do {
            uVar22 = uVar23 - bVar15;
            uVar32 = uVar22;
            if (7 < uVar22) {
              uVar32 = uVar44;
            }
            if (*puVar33 ==
                (byte)(*pbVar41 >> ((byte)uVar23 & 0x1f) & ~(byte)(-1 << (bVar15 & 0x1f)))) {
              *(undefined2 *)((long)out + lVar40 * 4 + 2) = 0;
            }
            lVar40 = lVar40 + 1;
            pbVar41 = pbVar41 + (7 < uVar22);
            uVar23 = uVar32;
          } while (width != (uint)lVar40);
        }
      }
    }
  }
  if ((uVar5 & 0x10) != 0) {
    if ((int)fmt < 4) {
      if (fmt == SPNG_FMT_RGBA8) {
        if (uVar29 != 0) {
          uVar27 = 0;
          do {
            uVar34 = uVar27 & 0xffffffff;
            bVar15 = *(byte *)((long)out + uVar34 + 1);
            bVar16 = *(byte *)((long)out + uVar34 + 2);
            bVar51 = *(byte *)((long)out + uVar34 + 3);
            uVar17 = sample_to_target((ushort)*(byte *)((long)out + uVar34),bit_depth,
                                      (uint)(ctx->decode_sb).red_bits,8);
            uVar19 = sample_to_target((ushort)bVar15,bit_depth,(uint)(ctx->decode_sb).green_bits,8);
            uVar20 = sample_to_target((ushort)bVar16,bit_depth,(uint)(ctx->decode_sb).blue_bits,8);
            uVar18 = sample_to_target((ushort)bVar51,bit_depth,(uint)(ctx->decode_sb).alpha_bits,8);
            *(char *)((long)out + uVar34) = (char)uVar17;
            *(char *)((long)out + uVar34 + 1) = (char)uVar19;
            *(char *)((long)out + uVar34 + 2) = (char)uVar20;
            *(char *)((long)out + uVar34 + 3) = (char)uVar18;
            uVar27 = uVar27 + 4;
          } while (uVar29 * 4 != uVar27);
        }
      }
      else if ((fmt == SPNG_FMT_RGBA16) && (uVar29 != 0)) {
        uVar27 = 0;
        do {
          uVar34 = uVar27 & 0xffffffff;
          uVar17 = *(uint16_t *)((long)out + uVar34 + 2);
          uVar19 = *(uint16_t *)((long)out + uVar34 + 4);
          uVar20 = *(uint16_t *)((long)out + uVar34 + 6);
          uVar18 = sample_to_target(*(uint16_t *)((long)out + uVar34),bit_depth,
                                    (uint)(ctx->decode_sb).red_bits,0x10);
          uVar17 = sample_to_target(uVar17,bit_depth,(uint)(ctx->decode_sb).green_bits,0x10);
          uVar19 = sample_to_target(uVar19,bit_depth,(uint)(ctx->decode_sb).blue_bits,0x10);
          uVar20 = sample_to_target(uVar20,bit_depth,(uint)(ctx->decode_sb).alpha_bits,0x10);
          *(uint16_t *)((long)out + uVar34) = uVar18;
          *(uint16_t *)((long)out + uVar34 + 2) = uVar17;
          *(uint16_t *)((long)out + uVar34 + 4) = uVar19;
          *(uint16_t *)((long)out + uVar34 + 6) = uVar20;
          uVar27 = uVar27 + 8;
        } while (uVar29 * 8 != uVar27);
      }
    }
    else if (fmt == SPNG_FMT_RGB8) {
      if (uVar29 != 0) {
        uVar27 = 0;
        do {
          uVar34 = uVar27 & 0xffffffff;
          bVar15 = *(byte *)((long)out + uVar34 + 1);
          bVar16 = *(byte *)((long)out + uVar34 + 2);
          uVar17 = sample_to_target((ushort)*(byte *)((long)out + uVar34),bit_depth,
                                    (uint)(ctx->decode_sb).red_bits,8);
          uVar19 = sample_to_target((ushort)bVar15,bit_depth,(uint)(ctx->decode_sb).green_bits,8);
          uVar20 = sample_to_target((ushort)bVar16,bit_depth,(uint)(ctx->decode_sb).blue_bits,8);
          *(char *)((long)out + uVar34) = (char)uVar17;
          *(char *)((long)out + uVar34 + 1) = (char)uVar19;
          *(char *)((long)out + uVar34 + 2) = (char)uVar20;
          uVar27 = uVar27 + 3;
        } while (uVar29 * 3 != uVar27);
      }
    }
    else if (fmt == SPNG_FMT_G8) {
      if (uVar29 != 0) {
        uVar27 = 0;
        do {
          uVar17 = sample_to_target((ushort)*(byte *)((long)out + uVar27),bit_depth,
                                    (uint)(ctx->decode_sb).grayscale_bits,8);
          *(char *)((long)out + uVar27) = (char)uVar17;
          uVar27 = uVar27 + 1;
        } while (uVar29 != uVar27);
      }
    }
    else if ((fmt == SPNG_FMT_GA8) && (uVar29 != 0)) {
      uVar27 = 0;
      do {
        uVar17 = sample_to_target((ushort)*(byte *)((long)out + (uVar27 & 0xffffffff)),bit_depth,
                                  (uint)(ctx->decode_sb).grayscale_bits,8);
        *(char *)((long)out + (uVar27 & 0xffffffff)) = (char)uVar17;
        uVar27 = uVar27 + 2;
      } while (uVar29 * 2 != uVar27);
    }
  }
  if ((uVar5 & 2) != 0) {
    if (fmt == SPNG_FMT_RGBA8) {
      if (uVar29 != 0) {
        uVar27 = 0;
        do {
          uVar34 = uVar27 & 0xffffffff;
          *(char *)((long)out + uVar34) = (char)puVar10[*(byte *)((long)out + uVar34)];
          *(char *)((long)out + uVar34 + 1) = (char)puVar10[*(byte *)((long)out + uVar34 + 1)];
          *(char *)((long)out + uVar34 + 2) = (char)puVar10[*(byte *)((long)out + uVar34 + 2)];
          uVar27 = uVar27 + 4;
        } while (uVar29 << 2 != uVar27);
      }
    }
    else if (fmt == SPNG_FMT_RGBA16) {
      if (uVar29 != 0) {
        uVar27 = 0;
        do {
          uVar34 = uVar27 & 0xffffffff;
          uVar17 = puVar10[*(ushort *)((long)out + uVar34 + 2)];
          uVar19 = puVar10[*(ushort *)((long)out + uVar34 + 4)];
          *(uint16_t *)((long)out + uVar34) = puVar10[*(ushort *)((long)out + uVar34)];
          *(uint16_t *)((long)out + uVar34 + 2) = uVar17;
          *(uint16_t *)((long)out + uVar34 + 4) = uVar19;
          uVar27 = uVar27 + 8;
        } while (uVar29 << 3 != uVar27);
      }
    }
    else if ((fmt == SPNG_FMT_RGB8) && (uVar29 != 0)) {
      uVar27 = 0;
      do {
        uVar34 = uVar27 & 0xffffffff;
        *(char *)((long)out + uVar34) = (char)puVar10[*(byte *)((long)out + uVar34)];
        *(char *)((long)out + uVar34 + 1) = (char)puVar10[*(byte *)((long)out + uVar34 + 1)];
        *(char *)((long)out + uVar34 + 2) = (char)puVar10[*(byte *)((long)out + uVar34 + 2)];
        uVar27 = uVar27 + 3;
      } while (uVar29 * 3 != uVar27);
    }
  }
  uVar2 = ctx->scanline;
  uVar3 = ctx->prev_scanline;
  auVar46._8_4_ = (int)uVar2;
  auVar46._0_8_ = uVar3;
  auVar46._12_4_ = (int)((ulong)uVar2 >> 0x20);
  ctx->scanline = (uchar *)uVar3;
  ctx->prev_scanline = (uchar *)auVar46._8_8_;
  iVar21 = update_row_info(ctx);
  if (iVar21 != 0x4b) {
    return iVar21;
  }
  if ((ctx->cur_chunk_bytes_left == 0) ||
     (iVar21 = discard_chunk_bytes(ctx,ctx->cur_chunk_bytes_left), iVar21 == 0)) {
    uVar9 = *(undefined4 *)&(ctx->current_chunk).field_0x14;
    (ctx->last_idat).crc = (ctx->current_chunk).crc;
    *(undefined4 *)&(ctx->last_idat).field_0x14 = uVar9;
    uVar8 = (ctx->current_chunk).length;
    uVar4 = (ctx->current_chunk).type[0];
    uVar12 = (ctx->current_chunk).type[1];
    uVar13 = (ctx->current_chunk).type[2];
    uVar14 = (ctx->current_chunk).type[3];
    (ctx->last_idat).offset = (ctx->current_chunk).offset;
    (ctx->last_idat).length = uVar8;
    (ctx->last_idat).type[0] = uVar4;
    (ctx->last_idat).type[1] = uVar12;
    (ctx->last_idat).type[2] = uVar13;
    (ctx->last_idat).type[3] = uVar14;
    return 0x4b;
  }
LAB_00102ee2:
  ctx->state = SPNG_STATE_INVALID;
  return iVar21;
switchD_001027cb_caseD_1:
LAB_00102a6e:
  if ((fmt & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
    if (fmt == SPNG_FMT_RGBA16) {
      if ((ctx->ihdr).bit_depth != '\x10') {
        uVar32 = (uint)(byte)local_80;
        local_ac = uVar44 & 0xff;
        uVar43 = (uint)(byte)local_78;
        local_a8 = local_94;
      }
      *puVar37 = (ushort)uVar32;
      puVar37[1] = (ushort)local_ac;
      puVar37[2] = (ushort)uVar43;
      puVar37[3] = (ushort)local_a8;
    }
  }
  else {
    if ((ctx->ihdr).bit_depth == '\x10') {
      local_80 = (ulong)(uVar32 >> 8);
      uVar44 = local_ac >> 8;
      local_78 = (ulong)(uVar43 >> 8);
      local_94 = local_a8 >> 8;
    }
    *(char *)puVar37 = (char)local_80;
    *(char *)((long)puVar37 + 1) = (char)uVar44;
    *(char *)(puVar37 + 1) = (char)local_78;
    if (fmt == SPNG_FMT_RGBA8) {
      *(char *)((long)puVar37 + 3) = (char)local_94;
    }
  }
LAB_00102b53:
  uVar36 = uVar36 + 6;
  uVar39 = uVar39 + 8;
  uVar38 = uVar38 + 2;
  uVar34 = uVar34 + 4;
  local_50 = local_50 + 1;
  uVar28 = uVar28 + 3;
  puVar37 = (ushort *)((long)puVar37 + lVar40);
  if (uVar27 == uVar34) goto LAB_00102c83;
  goto LAB_001027ab;
}

Assistant:

int spng_decode_scanline(spng_ctx *ctx, void *out, size_t len)
{
    if(ctx == NULL || out == NULL) return 1;

    if(ctx->state >= SPNG_STATE_EOI) return SPNG_EOI;

    struct decode_flags f = ctx->decode_flags;

    struct spng_row_info *ri = &ctx->row_info;
    const struct spng_subimage *sub = ctx->subimage;

    const struct spng_ihdr *ihdr = &ctx->ihdr;
    const uint16_t *gamma_lut = ctx->gamma_lut;
    unsigned char *trns_px = ctx->trns_px;
    const struct spng_sbit *sb = &ctx->decode_sb;
    const struct spng_plte_entry *plte = ctx->decode_plte.rgba;
    struct spng__iter iter = spng__iter_init(ihdr->bit_depth, ctx->scanline);

    const unsigned char *scanline;

    const int pass = ri->pass;
    const int fmt = ctx->fmt;
    const size_t scanline_width = sub[pass].scanline_width;
    const uint32_t width = sub[pass].width;
    uint32_t k;
    uint8_t r_8, g_8, b_8, a_8, gray_8;
    uint16_t r_16, g_16, b_16, a_16, gray_16;
    r_8=0; g_8=0; b_8=0; a_8=0; gray_8=0;
    r_16=0; g_16=0; b_16=0; a_16=0; gray_16=0;
    size_t pixel_size = 4; /* SPNG_FMT_RGBA8 */
    size_t pixel_offset = 0;
    unsigned char *pixel;
    unsigned processing_depth = ihdr->bit_depth;

    if(f.indexed) processing_depth = 8;

    if(fmt == SPNG_FMT_RGBA16) pixel_size = 8;
    else if(fmt == SPNG_FMT_RGB8) pixel_size = 3;

    if(len < sub[pass].out_width) return SPNG_EBUFSIZ;

    int ret = read_scanline(ctx);

    if(ret) return decode_err(ctx, ret);

    scanline = ctx->scanline;

    for(k=0; k < width; k++)
    {
        pixel = (unsigned char*)out + pixel_offset;
        pixel_offset += pixel_size;

        if(f.same_layout)
        {
            if(f.zerocopy) break;

            memcpy(out, scanline, scanline_width - 1);
            break;
        }

        if(f.unpack)
        {
            unpack_scanline(out, scanline, width, ihdr->bit_depth, fmt);
            break;
        }

        if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 6), 2);
                memcpy(&g_16, scanline + (k * 6) + 2, 2);
                memcpy(&b_16, scanline + (k * 6) + 4, 2);

                a_16 = 65535;
            }
            else /* == 8 */
            {
                if(fmt == SPNG_FMT_RGBA8)
                {
                    rgb8_row_to_rgba8(scanline, out, width);
                    break;
                }

                r_8 = scanline[k * 3];
                g_8 = scanline[k * 3 + 1];
                b_8 = scanline[k * 3 + 2];

                a_8 = 255;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_INDEXED)
        {
            uint8_t entry = 0;

            if(ihdr->bit_depth == 8)
            {
                if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
                {
                    expand_row(out, scanline, &ctx->decode_plte, width, fmt);
                    break;
                }

                entry = scanline[k];
            }
            else /* < 8 */
            {
                entry = get_sample(&iter);
            }

            if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
            {
                pixel[0] = plte[entry].red;
                pixel[1] = plte[entry].green;
                pixel[2] = plte[entry].blue;
                if(fmt == SPNG_FMT_RGBA8) pixel[3] = plte[entry].alpha;

                continue;
            }
            else /* RGBA16 */
            {
                r_16 = plte[entry].red;
                g_16 = plte[entry].green;
                b_16 = plte[entry].blue;
                a_16 = plte[entry].alpha;

                r_16 = (r_16 << 8) | r_16;
                g_16 = (g_16 << 8) | g_16;
                b_16 = (b_16 << 8) | b_16;
                a_16 = (a_16 << 8) | a_16;

                memcpy(pixel, &r_16, 2);
                memcpy(pixel + 2, &g_16, 2);
                memcpy(pixel + 4, &b_16, 2);
                memcpy(pixel + 6, &a_16, 2);

                continue;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 8), 2);
                memcpy(&g_16, scanline + (k * 8) + 2, 2);
                memcpy(&b_16, scanline + (k * 8) + 4, 2);
                memcpy(&a_16, scanline + (k * 8) + 6, 2);
            }
            else /* == 8 */
            {
                r_8 = scanline[k * 4];
                g_8 = scanline[k * 4 + 1];
                b_8 = scanline[k * 4 + 2];
                a_8 = scanline[k * 4 + 3];
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + k * 2, 2);

                if(f.apply_trns && ctx->trns.gray == gray_16) a_16 = 0;
                else a_16 = 65535;

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* <= 8 */
            {
                gray_8 = get_sample(&iter);

                if(f.apply_trns && ctx->trns.gray == gray_8) a_8 = 0;
                else a_8 = 255;

                r_8 = gray_8; g_8 = gray_8; b_8 = gray_8;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + (k * 4), 2);
                memcpy(&a_16, scanline + (k * 4) + 2, 2);

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* == 8 */
            {
                gray_8 = scanline[k * 2];
                a_8 = scanline[k * 2 + 1];

                r_8 = gray_8;
                g_8 = gray_8;
                b_8 = gray_8;
            }
        }


        if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
        {
            if(ihdr->bit_depth == 16)
            {
                r_8 = r_16 >> 8;
                g_8 = g_16 >> 8;
                b_8 = b_16 >> 8;
                a_8 = a_16 >> 8;
            }

            pixel[0] = r_8;
            pixel[1] = g_8;
            pixel[2] = b_8;

            if(fmt == SPNG_FMT_RGBA8) pixel[3] = a_8;
        }
        else if(fmt == SPNG_FMT_RGBA16)
        {
            if(ihdr->bit_depth != 16)
            {
                r_16 = r_8;
                g_16 = g_8;
                b_16 = b_8;
                a_16 = a_8;
            }

            memcpy(pixel, &r_16, 2);
            memcpy(pixel + 2, &g_16, 2);
            memcpy(pixel + 4, &b_16, 2);
            memcpy(pixel + 6, &a_16, 2);
        }
    }/* for(k=0; k < width; k++) */

    if(f.apply_trns) trns_row(out, scanline, trns_px, ctx->bytes_per_pixel, &ctx->ihdr, width, fmt);

    if(f.do_scaling) scale_row(out, width, fmt, processing_depth, sb);

    if(f.apply_gamma) gamma_correct_row(out, width, fmt, gamma_lut);

    /* The previous scanline is always defiltered */
    void *t = ctx->prev_scanline;
    ctx->prev_scanline = ctx->scanline;
    ctx->scanline = t;

    ret = update_row_info(ctx);

    if(ret == SPNG_EOI)
    {
        if(ctx->cur_chunk_bytes_left) /* zlib stream ended before an IDAT chunk boundary */
        {/* Discard the rest of the chunk */
            int error = discard_chunk_bytes(ctx, ctx->cur_chunk_bytes_left);
            if(error) return decode_err(ctx, error);
        }

        ctx->last_idat = ctx->current_chunk;
    }

    return ret;
}